

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

Var Js::DataView::EntrySetFloat32(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  DataView *this;
  double dVar7;
  int in_stack_00000010;
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x245,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b4874c;
    *puVar5 = 0;
  }
  callInfo_local = local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_50);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x248,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b4874c;
    *puVar5 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) == 1) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec20,L"offset");
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar3 = VarIs<Js::DataView>(pvVar6);
    if (bVar3) {
      args.super_Arguments.Values._4_4_ = NAN;
      BVar4 = 0;
      if (2 < (callInfo_local._0_4_ & 0xffffff)) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
        BVar4 = JavascriptOperators::IsUndefined(pvVar6);
        if (BVar4 == 0) {
          pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
          if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) {
LAB_00b4874c:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar5 = 0;
          }
          if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
            dVar7 = (double)(int)pvVar6;
          }
          else if ((ulong)pvVar6 >> 0x32 == 0) {
            dVar7 = JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
          }
          else {
            dVar7 = (double)((ulong)pvVar6 ^ 0xfffc000000000000);
          }
          args.super_Arguments.Values._4_4_ = (float)dVar7;
        }
        BVar4 = 0;
        if (((ulong)callInfo_local & 0xfffffc) != 0) {
          pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,3);
          BVar4 = JavascriptConversion::ToBoolean(pvVar6,pSVar1);
        }
      }
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      this = VarTo<Js::DataView>(pvVar6);
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      SetValue<float,float*>
                (this,pvVar6,args.super_Arguments.Values._4_4_,BVar4,
                 L"DataView.prototype.SetFloat32");
      return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec21,(PCWSTR)0x0);
}

Assistant:

Var DataView::EntrySetFloat32(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        BOOL isLittleEndian = FALSE;
        float value = static_cast<float>(JavascriptNumber::NaN);
        switch (args.Info.Count)
        {
        case 0:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
            break;
        case 1:
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("offset"));
            break;
        default:
            if (!VarIs<DataView>(args[0]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
                break;
            }
            if (args.Info.Count > 2)
            {
                if (!JavascriptOperators::IsUndefined(args[2]))
                {
                    value = JavascriptConversion::ToFloat(args[2], scriptContext);
                }
                if (args.Info.Count > 3)
                {
                    isLittleEndian = JavascriptConversion::ToBoolean(args[3], scriptContext);
                }
            }
            break;
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        dataView->SetValue<float>(args[1], value, _u("DataView.prototype.SetFloat32"), isLittleEndian);
        return scriptContext->GetLibrary()->GetUndefined();
    }